

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qssldiffiehellmanparameters_openssl.cpp
# Opt level: O0

int __thiscall
QTlsBackendOpenSSL::dhParametersFromDer
          (QTlsBackendOpenSSL *this,QByteArray *der,QByteArray *derData)

{
  long lVar1;
  bool bVar2;
  undefined4 uVar3;
  qsizetype qVar4;
  DH *pDVar5;
  QByteArray *in_RDX;
  QByteArray *in_RSI;
  long in_FS_OFFSET;
  DH *dh;
  int len;
  uchar *data;
  QScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_plugins_tls_openssl_qssldiffiehellmanparameters_openssl_cpp:90:41)>
  dhRaii;
  anon_class_8_1_3fcf6542_for_m_func *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint uVar6;
  DH **in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int local_2c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QByteArray::isEmpty((QByteArray *)0x15c8ef);
  if (bVar2) {
    local_2c = 1;
  }
  else {
    QByteArray::data((QByteArray *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    qVar4 = QByteArray::size(in_RSI);
    uVar3 = (undefined4)qVar4;
    QSslSocketPrivate::ensureInitialized();
    pDVar5 = q_d2i_DHparams(in_stack_ffffffffffffffa8,
                            (uchar **)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            (long)in_stack_ffffffffffffff98);
    if (pDVar5 == (DH *)0x0) {
      local_2c = 1;
    }
    else {
      qScopeGuard<QTlsBackendOpenSSL::dhParametersFromDer(QByteArray_const&,QByteArray*)const::__0>
                (in_stack_ffffffffffffff98);
      bVar2 = anon_unknown.dwarf_12a1c7::isSafeDH((DH *)CONCAT44(uVar3,in_stack_ffffffffffffffb0));
      if (bVar2) {
        QByteArray::operator=(in_RDX,(QByteArray *)in_RSI);
      }
      else {
        local_2c = 2;
      }
      uVar6 = (uint)!bVar2;
      QScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/plugins/tls/openssl/qssldiffiehellmanparameters_openssl.cpp:90:41)>
      ::~QScopeGuard((QScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_plugins_tls_openssl_qssldiffiehellmanparameters_openssl_cpp:90:41)>
                      *)(ulong)CONCAT14(!bVar2,in_stack_ffffffffffffffa0));
      if (uVar6 == 0) {
        local_2c = 0;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_2c;
}

Assistant:

int QTlsBackendOpenSSL::dhParametersFromDer(const QByteArray &der, QByteArray *derData) const
{
#ifndef OPENSSL_NO_DEPRECATED_3_0
    Q_ASSERT(derData);

    if (der.isEmpty())
        return DHParams::InvalidInputDataError;

    const unsigned char *data = reinterpret_cast<const unsigned char *>(der.data());
    const int len = der.size();

    // TLSTODO: check it's needed (loading ciphers and certs in
    // addition to the library!)
    QSslSocketPrivate::ensureInitialized();

    DH *dh = q_d2i_DHparams(nullptr, &data, len);
    if (dh) {
        const auto dhRaii = qScopeGuard([dh] {q_DH_free(dh);});

        if (isSafeDH(dh))
            *derData = der;
        else
            return DHParams::UnsafeParametersError;
    } else {
        return DHParams::InvalidInputDataError;
    }
#else
    Q_UNUSED(der);
    Q_UNUSED(derData);
    qCWarning(lcTlsBackend, "Diffie-Hellman parameters are not supported, because OpenSSL v3 was built with deprecated API removed");
#endif
    return DHParams::NoError;
}